

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O1

void av1_fwd_txfm2d_16x16_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined1 auVar1 [16];
  byte bVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int8_t *piVar7;
  int iVar8;
  undefined7 in_register_00000009;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  __m256i in [32];
  __m256i out [32];
  __m256i local_c20;
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  undefined8 auStack_810 [2];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  
  piVar7 = av1_fwd_txfm_shift_ls[2];
  if (0xf < (uint)CONCAT71(in_register_00000009,tx_type)) {
    return;
  }
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar31._4_4_ = iVar8;
      auVar31._0_4_ = iVar8;
      auVar31._8_4_ = iVar8;
      auVar31._12_4_ = iVar8;
      auVar31._16_4_ = iVar8;
      auVar31._20_4_ = iVar8;
      auVar31._24_4_ = iVar8;
      auVar31._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar31,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fdct16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar33._4_4_ = iVar8;
      auVar33._0_4_ = iVar8;
      auVar33._8_4_ = iVar8;
      auVar33._12_4_ = iVar8;
      auVar33._16_4_ = iVar8;
      auVar33._20_4_ = iVar8;
      auVar33._24_4_ = iVar8;
      auVar33._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar33,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    goto LAB_0048290d;
  case 1:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar32._4_4_ = iVar8;
      auVar32._0_4_ = iVar8;
      auVar32._8_4_ = iVar8;
      auVar32._12_4_ = iVar8;
      auVar32._16_4_ = iVar8;
      auVar32._20_4_ = iVar8;
      auVar32._24_4_ = iVar8;
      auVar32._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar32,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fadst16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar34._4_4_ = iVar8;
      auVar34._0_4_ = iVar8;
      auVar34._8_4_ = iVar8;
      auVar34._12_4_ = iVar8;
      auVar34._16_4_ = iVar8;
      auVar34._20_4_ = iVar8;
      auVar34._24_4_ = iVar8;
      auVar34._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar34,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    goto LAB_0048290d;
  case 2:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar23._4_4_ = iVar8;
      auVar23._0_4_ = iVar8;
      auVar23._8_4_ = iVar8;
      auVar23._12_4_ = iVar8;
      auVar23._16_4_ = iVar8;
      auVar23._20_4_ = iVar8;
      auVar23._24_4_ = iVar8;
      auVar23._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar23,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fdct16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar24._4_4_ = iVar8;
      auVar24._0_4_ = iVar8;
      auVar24._8_4_ = iVar8;
      auVar24._12_4_ = iVar8;
      auVar24._16_4_ = iVar8;
      auVar24._20_4_ = iVar8;
      auVar24._24_4_ = iVar8;
      auVar24._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar24,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    break;
  case 3:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar27._4_4_ = iVar8;
      auVar27._0_4_ = iVar8;
      auVar27._8_4_ = iVar8;
      auVar27._12_4_ = iVar8;
      auVar27._16_4_ = iVar8;
      auVar27._20_4_ = iVar8;
      auVar27._24_4_ = iVar8;
      auVar27._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar27,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fadst16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar28._4_4_ = iVar8;
      auVar28._0_4_ = iVar8;
      auVar28._8_4_ = iVar8;
      auVar28._12_4_ = iVar8;
      auVar28._16_4_ = iVar8;
      auVar28._20_4_ = iVar8;
      auVar28._24_4_ = iVar8;
      auVar28._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar28,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    break;
  case 4:
    lVar9 = 0x200;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_840 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_840 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_840 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_840 + lVar9 + 0x18) = uVar6;
      input = input + stride;
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != 0);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar16._4_4_ = iVar8;
      auVar16._0_4_ = iVar8;
      auVar16._8_4_ = iVar8;
      auVar16._12_4_ = iVar8;
      auVar16._16_4_ = iVar8;
      auVar16._20_4_ = iVar8;
      auVar16._24_4_ = iVar8;
      auVar16._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar16,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fadst16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar17._4_4_ = iVar8;
      auVar17._0_4_ = iVar8;
      auVar17._8_4_ = iVar8;
      auVar17._12_4_ = iVar8;
      auVar17._16_4_ = iVar8;
      auVar17._20_4_ = iVar8;
      auVar17._24_4_ = iVar8;
      auVar17._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar17,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    goto LAB_0048290d;
  case 5:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])(local_820 + lVar9 + 0x10);
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])(local_820 + lVar9),_DAT_0056bda0);
      auVar55 = vpmovsxwd_avx2(auVar3);
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar55;
      auVar1 = vpshufb_avx(auVar1,_DAT_0056bda0);
      auVar55 = vpmovsxwd_avx2(auVar1);
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar35._4_4_ = iVar8;
      auVar35._0_4_ = iVar8;
      auVar35._8_4_ = iVar8;
      auVar35._12_4_ = iVar8;
      auVar35._16_4_ = iVar8;
      auVar35._20_4_ = iVar8;
      auVar35._24_4_ = iVar8;
      auVar35._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar35,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fdct16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar36._4_4_ = iVar8;
      auVar36._0_4_ = iVar8;
      auVar36._8_4_ = iVar8;
      auVar36._12_4_ = iVar8;
      auVar36._16_4_ = iVar8;
      auVar36._20_4_ = iVar8;
      auVar36._24_4_ = iVar8;
      auVar36._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar36,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    break;
  case 6:
    lVar9 = 0x200;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_840 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_840 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_840 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_840 + lVar9 + 0x18) = uVar6;
      input = input + stride;
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != 0);
    lVar9 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])(local_820 + lVar9 + 0x10);
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])(local_820 + lVar9),_DAT_0056bda0);
      auVar55 = vpmovsxwd_avx2(auVar3);
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar55;
      auVar1 = vpshufb_avx(auVar1,_DAT_0056bda0);
      auVar55 = vpmovsxwd_avx2(auVar1);
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar40._4_4_ = iVar8;
      auVar40._0_4_ = iVar8;
      auVar40._8_4_ = iVar8;
      auVar40._12_4_ = iVar8;
      auVar40._16_4_ = iVar8;
      auVar40._20_4_ = iVar8;
      auVar40._24_4_ = iVar8;
      auVar40._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar40,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fadst16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar41._4_4_ = iVar8;
      auVar41._0_4_ = iVar8;
      auVar41._8_4_ = iVar8;
      auVar41._12_4_ = iVar8;
      auVar41._16_4_ = iVar8;
      auVar41._20_4_ = iVar8;
      auVar41._24_4_ = iVar8;
      auVar41._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar41,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    break;
  case 7:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])(local_820 + lVar9 + 0x10);
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])(local_820 + lVar9),_DAT_0056bda0);
      auVar55 = vpmovsxwd_avx2(auVar3);
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar55;
      auVar1 = vpshufb_avx(auVar1,_DAT_0056bda0);
      auVar55 = vpmovsxwd_avx2(auVar1);
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar29._4_4_ = iVar8;
      auVar29._0_4_ = iVar8;
      auVar29._8_4_ = iVar8;
      auVar29._12_4_ = iVar8;
      auVar29._16_4_ = iVar8;
      auVar29._20_4_ = iVar8;
      auVar29._24_4_ = iVar8;
      auVar29._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar29,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fadst16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar30._4_4_ = iVar8;
      auVar30._0_4_ = iVar8;
      auVar30._8_4_ = iVar8;
      auVar30._12_4_ = iVar8;
      auVar30._16_4_ = iVar8;
      auVar30._20_4_ = iVar8;
      auVar30._24_4_ = iVar8;
      auVar30._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar30,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    break;
  case 8:
    lVar9 = 0x200;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_840 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_840 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_840 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_840 + lVar9 + 0x18) = uVar6;
      input = input + stride;
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != 0);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar45._4_4_ = iVar8;
      auVar45._0_4_ = iVar8;
      auVar45._8_4_ = iVar8;
      auVar45._12_4_ = iVar8;
      auVar45._16_4_ = iVar8;
      auVar45._20_4_ = iVar8;
      auVar45._24_4_ = iVar8;
      auVar45._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar45,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fadst16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar46._4_4_ = iVar8;
      auVar46._0_4_ = iVar8;
      auVar46._8_4_ = iVar8;
      auVar46._12_4_ = iVar8;
      auVar46._16_4_ = iVar8;
      auVar46._20_4_ = iVar8;
      auVar46._24_4_ = iVar8;
      auVar46._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    break;
  case 9:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar21._4_4_ = iVar8;
      auVar21._0_4_ = iVar8;
      auVar21._8_4_ = iVar8;
      auVar21._12_4_ = iVar8;
      auVar21._16_4_ = iVar8;
      auVar21._20_4_ = iVar8;
      auVar21._24_4_ = iVar8;
      auVar21._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar21,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    lVar9 = 0;
    auVar22._8_4_ = 0x2d42;
    auVar22._0_8_ = 0x2d4200002d42;
    auVar22._12_4_ = 0x2d42;
    auVar22._16_4_ = 0x2d42;
    auVar22._20_4_ = 0x2d42;
    auVar22._24_4_ = 0x2d42;
    auVar22._28_4_ = 0x2d42;
    auVar50._8_4_ = 0x800;
    auVar50._0_8_ = 0x80000000800;
    auVar50._12_4_ = 0x800;
    auVar50._16_4_ = 0x800;
    auVar50._20_4_ = 0x800;
    auVar50._24_4_ = 0x800;
    auVar50._28_4_ = 0x800;
    do {
      auVar55 = vpmulld_avx2(auVar22,*(undefined1 (*) [32])((long)local_c20 + lVar9));
      auVar55 = vpaddd_avx2(auVar55,auVar50);
      auVar55 = vpsrad_avx2(auVar55,0xc);
      *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x400);
    bVar2 = av1_fwd_txfm_shift_ls[2][1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar54._4_4_ = iVar8;
      auVar54._0_4_ = iVar8;
      auVar54._8_4_ = iVar8;
      auVar54._12_4_ = iVar8;
      auVar54._16_4_ = iVar8;
      auVar54._20_4_ = iVar8;
      auVar54._24_4_ = iVar8;
      auVar54._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar54,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    auVar12 = vunpcklps_avx((undefined1  [32])_local_820,local_7e0);
    auVar51 = vunpckhps_avx((undefined1  [32])_local_820,local_7e0);
    auVar47 = vunpcklps_avx(local_7a0,local_760);
    auVar26 = vunpckhps_avx(local_7a0,local_760);
    auVar37 = vunpcklps_avx(local_720,local_6e0);
    auVar10 = vunpckhps_avx(local_720,local_6e0);
    auVar38 = vunpcklps_avx(local_6a0,local_660);
    auVar11 = vunpckhps_avx(local_6a0,local_660);
    auVar55 = vunpcklpd_avx(auVar12,auVar47);
    auVar25 = vunpcklpd_avx(auVar37,auVar38);
    local_c20[0] = SUB168(auVar55._0_16_,0);
    local_c20[1] = SUB168(auVar55._0_16_,8);
    local_c20[2] = SUB168(auVar25._0_16_,0);
    local_c20[3] = SUB168(auVar25._0_16_,8);
    local_b20 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar12,auVar47);
    auVar25 = vunpckhpd_avx(auVar37,auVar38);
    local_be0._16_16_ = auVar25._0_16_;
    local_be0._0_16_ = auVar55._0_16_;
    local_ae0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpcklpd_avx(auVar51,auVar26);
    auVar25 = vunpcklpd_avx(auVar10,auVar11);
    local_ba0._16_16_ = auVar25._0_16_;
    local_ba0._0_16_ = auVar55._0_16_;
    local_aa0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar51,auVar26);
    auVar25 = vunpckhpd_avx(auVar10,auVar11);
    local_b60._16_16_ = auVar25._0_16_;
    local_b60._0_16_ = auVar55._0_16_;
    local_a60 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar12 = vunpcklps_avx(local_800,local_7c0);
    auVar51 = vunpckhps_avx(local_800,local_7c0);
    auVar47 = vunpcklps_avx(local_780,local_740);
    auVar26 = vunpckhps_avx(local_780,local_740);
    auVar37 = vunpcklps_avx(local_700,local_6c0);
    auVar10 = vunpckhps_avx(local_700,local_6c0);
    auVar38 = vunpcklps_avx(local_680,local_640);
    auVar11 = vunpckhps_avx(local_680,local_640);
    auVar55 = vunpcklpd_avx(auVar12,auVar47);
    auVar25 = vunpcklpd_avx(auVar37,auVar38);
    local_a20._16_16_ = auVar25._0_16_;
    local_a20._0_16_ = auVar55._0_16_;
    local_920 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar12,auVar47);
    auVar25 = vunpckhpd_avx(auVar37,auVar38);
    local_9e0._16_16_ = auVar25._0_16_;
    local_9e0._0_16_ = auVar55._0_16_;
    local_8e0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpcklpd_avx(auVar51,auVar26);
    auVar25 = vunpcklpd_avx(auVar10,auVar11);
    local_9a0._16_16_ = auVar25._0_16_;
    local_9a0._0_16_ = auVar55._0_16_;
    local_8a0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar51,auVar26);
    auVar25 = vunpckhpd_avx(auVar10,auVar11);
    local_960._16_16_ = auVar25._0_16_;
    local_960._0_16_ = auVar55._0_16_;
    local_860 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar12 = vunpcklps_avx(local_620,local_5e0);
    auVar51 = vunpckhps_avx(local_620,local_5e0);
    auVar47 = vunpcklps_avx(local_5a0,local_560);
    auVar26 = vunpckhps_avx(local_5a0,local_560);
    auVar37 = vunpcklps_avx(local_520,local_4e0);
    auVar10 = vunpckhps_avx(local_520,local_4e0);
    auVar38 = vunpcklps_avx(local_4a0,local_460);
    auVar11 = vunpckhps_avx(local_4a0,local_460);
    auVar55 = vunpcklpd_avx(auVar12,auVar47);
    auVar25 = vunpcklpd_avx(auVar37,auVar38);
    local_c00._16_16_ = auVar25._0_16_;
    local_c00._0_16_ = auVar55._0_16_;
    local_b00 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar12,auVar47);
    auVar25 = vunpckhpd_avx(auVar37,auVar38);
    local_bc0._16_16_ = auVar25._0_16_;
    local_bc0._0_16_ = auVar55._0_16_;
    local_ac0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpcklpd_avx(auVar51,auVar26);
    auVar25 = vunpcklpd_avx(auVar10,auVar11);
    local_b80._16_16_ = auVar25._0_16_;
    local_b80._0_16_ = auVar55._0_16_;
    local_a80 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar51,auVar26);
    auVar25 = vunpckhpd_avx(auVar10,auVar11);
    local_b40._16_16_ = auVar25._0_16_;
    local_b40._0_16_ = auVar55._0_16_;
    local_a40 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar10 = vpunpckldq_avx2(local_600,local_5c0);
    auVar55 = vpunpckhdq_avx2(local_600,local_5c0);
    auVar11 = vpunpckldq_avx2(local_580,local_540);
    auVar25 = vpunpckhdq_avx2(local_580,local_540);
    auVar12 = vpunpckldq_avx2(local_500,local_4c0);
    auVar51 = vpunpckhdq_avx2(local_500,local_4c0);
    auVar47 = vpunpckldq_avx2(local_480,local_440);
    auVar26 = vpunpckhdq_avx2(local_480,local_440);
    auVar37 = vpunpcklqdq_avx2(auVar10,auVar11);
    auVar38 = vpunpcklqdq_avx2(auVar12,auVar47);
    local_a00._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
    local_a00._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
    local_900 = vperm2i128_avx2(auVar37,auVar38,0x31);
    auVar10 = vpunpckhqdq_avx2(auVar10,auVar11);
    auVar11 = vpunpckhqdq_avx2(auVar12,auVar47);
    local_9c0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_9c0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_8c0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar10 = vpunpcklqdq_avx2(auVar55,auVar25);
    auVar11 = vpunpcklqdq_avx2(auVar51,auVar26);
    local_980._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_980._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_880 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar55 = vpunpckhqdq_avx2(auVar55,auVar25);
    auVar25 = vpunpckhqdq_avx2(auVar51,auVar26);
    local_940._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar55._0_16_;
    local_940._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar25._0_16_;
    local_840 = vperm2i128_avx2(auVar55,auVar25,0x31);
    lVar9 = 0;
    do {
      auVar55 = vpmulld_avx2(auVar22,*(undefined1 (*) [32])((long)local_c20 + lVar9));
      auVar55 = vpaddd_avx2(auVar55,auVar50);
      auVar55 = vpsrad_avx2(auVar55,0xc);
      *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x400);
    goto LAB_00483955;
  case 10:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar42._4_4_ = iVar8;
      auVar42._0_4_ = iVar8;
      auVar42._8_4_ = iVar8;
      auVar42._12_4_ = iVar8;
      auVar42._16_4_ = iVar8;
      auVar42._20_4_ = iVar8;
      auVar42._24_4_ = iVar8;
      auVar42._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar42,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fdct16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar43._4_4_ = iVar8;
      auVar43._0_4_ = iVar8;
      auVar43._8_4_ = iVar8;
      auVar43._12_4_ = iVar8;
      auVar43._16_4_ = iVar8;
      auVar43._20_4_ = iVar8;
      auVar43._24_4_ = iVar8;
      auVar43._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar43,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    auVar10 = vpunpckldq_avx2((undefined1  [32])_local_820,local_7e0);
    auVar55 = vpunpckhdq_avx2((undefined1  [32])_local_820,local_7e0);
    auVar11 = vpunpckldq_avx2(local_7a0,local_760);
    auVar25 = vpunpckhdq_avx2(local_7a0,local_760);
    auVar12 = vpunpckldq_avx2(local_720,local_6e0);
    auVar51 = vpunpckhdq_avx2(local_720,local_6e0);
    auVar47 = vpunpckldq_avx2(local_6a0,local_660);
    auVar26 = vpunpckhdq_avx2(local_6a0,local_660);
    auVar37 = vpunpcklqdq_avx2(auVar10,auVar11);
    auVar38 = vpunpcklqdq_avx2(auVar12,auVar47);
    auVar58 = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
    auVar61 = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
    local_c20[0] = auVar58._0_8_;
    local_c20[1] = auVar58._8_8_;
    local_c20[2] = auVar61._0_8_;
    local_c20[3] = auVar61._8_8_;
    local_b20 = vperm2i128_avx2(auVar37,auVar38,0x31);
    auVar10 = vpunpckhqdq_avx2(auVar10,auVar11);
    auVar11 = vpunpckhqdq_avx2(auVar12,auVar47);
    local_be0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_be0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_ae0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar10 = vpunpcklqdq_avx2(auVar55,auVar25);
    auVar11 = vpunpcklqdq_avx2(auVar51,auVar26);
    local_ba0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_ba0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_aa0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar55 = vpunpckhqdq_avx2(auVar55,auVar25);
    auVar25 = vpunpckhqdq_avx2(auVar51,auVar26);
    local_b60._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar55._0_16_;
    local_b60._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar25._0_16_;
    local_a60 = vperm2i128_avx2(auVar55,auVar25,0x31);
    auVar12 = vunpcklps_avx(local_800,local_7c0);
    auVar51 = vunpckhps_avx(local_800,local_7c0);
    auVar47 = vunpcklps_avx(local_780,local_740);
    auVar26 = vunpckhps_avx(local_780,local_740);
    auVar37 = vunpcklps_avx(local_700,local_6c0);
    auVar10 = vunpckhps_avx(local_700,local_6c0);
    auVar38 = vunpcklps_avx(local_680,local_640);
    auVar11 = vunpckhps_avx(local_680,local_640);
    auVar55 = vunpcklpd_avx(auVar12,auVar47);
    auVar25 = vunpcklpd_avx(auVar37,auVar38);
    local_a20._16_16_ = auVar25._0_16_;
    local_a20._0_16_ = auVar55._0_16_;
    local_920 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar12,auVar47);
    auVar25 = vunpckhpd_avx(auVar37,auVar38);
    local_9e0._16_16_ = auVar25._0_16_;
    local_9e0._0_16_ = auVar55._0_16_;
    local_8e0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpcklpd_avx(auVar51,auVar26);
    auVar25 = vunpcklpd_avx(auVar10,auVar11);
    local_9a0._16_16_ = auVar25._0_16_;
    local_9a0._0_16_ = auVar55._0_16_;
    local_8a0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar51,auVar26);
    auVar25 = vunpckhpd_avx(auVar10,auVar11);
    local_960._16_16_ = auVar25._0_16_;
    local_960._0_16_ = auVar55._0_16_;
    local_860 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar12 = vunpcklps_avx(local_620,local_5e0);
    auVar51 = vunpckhps_avx(local_620,local_5e0);
    auVar47 = vunpcklps_avx(local_5a0,local_560);
    auVar26 = vunpckhps_avx(local_5a0,local_560);
    auVar37 = vunpcklps_avx(local_520,local_4e0);
    auVar10 = vunpckhps_avx(local_520,local_4e0);
    auVar38 = vunpcklps_avx(local_4a0,local_460);
    auVar11 = vunpckhps_avx(local_4a0,local_460);
    auVar55 = vunpcklpd_avx(auVar12,auVar47);
    auVar25 = vunpcklpd_avx(auVar37,auVar38);
    local_c00._16_16_ = auVar25._0_16_;
    local_c00._0_16_ = auVar55._0_16_;
    local_b00 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar12,auVar47);
    auVar25 = vunpckhpd_avx(auVar37,auVar38);
    local_bc0._16_16_ = auVar25._0_16_;
    local_bc0._0_16_ = auVar55._0_16_;
    local_ac0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpcklpd_avx(auVar51,auVar26);
    auVar25 = vunpcklpd_avx(auVar10,auVar11);
    local_b80._16_16_ = auVar25._0_16_;
    local_b80._0_16_ = auVar55._0_16_;
    local_a80 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar51,auVar26);
    auVar25 = vunpckhpd_avx(auVar10,auVar11);
    local_b40._16_16_ = auVar25._0_16_;
    local_b40._0_16_ = auVar55._0_16_;
    local_a40 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar10 = vpunpckldq_avx2(local_600,local_5c0);
    auVar55 = vpunpckhdq_avx2(local_600,local_5c0);
    auVar11 = vpunpckldq_avx2(local_580,local_540);
    auVar25 = vpunpckhdq_avx2(local_580,local_540);
    auVar12 = vpunpckldq_avx2(local_500,local_4c0);
    auVar51 = vpunpckhdq_avx2(local_500,local_4c0);
    auVar47 = vpunpckldq_avx2(local_480,local_440);
    auVar26 = vpunpckhdq_avx2(local_480,local_440);
    auVar37 = vpunpcklqdq_avx2(auVar10,auVar11);
    auVar38 = vpunpcklqdq_avx2(auVar12,auVar47);
    local_a00._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
    local_a00._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
    local_900 = vperm2i128_avx2(auVar37,auVar38,0x31);
    auVar10 = vpunpckhqdq_avx2(auVar10,auVar11);
    auVar11 = vpunpckhqdq_avx2(auVar12,auVar47);
    local_9c0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_9c0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_8c0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar10 = vpunpcklqdq_avx2(auVar55,auVar25);
    auVar11 = vpunpcklqdq_avx2(auVar51,auVar26);
    local_980._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_980._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_880 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar55 = vpunpckhqdq_avx2(auVar55,auVar25);
    auVar25 = vpunpckhqdq_avx2(auVar51,auVar26);
    local_940._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar55._0_16_;
    local_940._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar25._0_16_;
    local_840 = vperm2i128_avx2(auVar55,auVar25,0x31);
    lVar9 = 0;
    auVar44._8_4_ = 0x2d42;
    auVar44._0_8_ = 0x2d4200002d42;
    auVar44._12_4_ = 0x2d42;
    auVar44._16_4_ = 0x2d42;
    auVar44._20_4_ = 0x2d42;
    auVar44._24_4_ = 0x2d42;
    auVar44._28_4_ = 0x2d42;
    auVar53._8_4_ = 0x800;
    auVar53._0_8_ = 0x80000000800;
    auVar53._12_4_ = 0x800;
    auVar53._16_4_ = 0x800;
    auVar53._20_4_ = 0x800;
    auVar53._24_4_ = 0x800;
    auVar53._28_4_ = 0x800;
    do {
      auVar55 = vpmulld_avx2(auVar44,*(undefined1 (*) [32])((long)local_c20 + lVar9));
      auVar55 = vpaddd_avx2(auVar55,auVar53);
      auVar55 = vpsrad_avx2(auVar55,0xc);
      *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x400);
    goto LAB_00483955;
  case 0xb:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar13._4_4_ = iVar8;
      auVar13._0_4_ = iVar8;
      auVar13._8_4_ = iVar8;
      auVar13._12_4_ = iVar8;
      auVar13._16_4_ = iVar8;
      auVar13._20_4_ = iVar8;
      auVar13._24_4_ = iVar8;
      auVar13._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar13,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    lVar9 = 0;
    auVar14._8_4_ = 0x2d42;
    auVar14._0_8_ = 0x2d4200002d42;
    auVar14._12_4_ = 0x2d42;
    auVar14._16_4_ = 0x2d42;
    auVar14._20_4_ = 0x2d42;
    auVar14._24_4_ = 0x2d42;
    auVar14._28_4_ = 0x2d42;
    auVar48._8_4_ = 0x800;
    auVar48._0_8_ = 0x80000000800;
    auVar48._12_4_ = 0x800;
    auVar48._16_4_ = 0x800;
    auVar48._20_4_ = 0x800;
    auVar48._24_4_ = 0x800;
    auVar48._28_4_ = 0x800;
    do {
      auVar55 = vpmulld_avx2(auVar14,*(undefined1 (*) [32])((long)local_c20 + lVar9));
      auVar55 = vpaddd_avx2(auVar55,auVar48);
      auVar55 = vpsrad_avx2(auVar55,0xc);
      *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x400);
    bVar2 = av1_fwd_txfm_shift_ls[2][1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar15._4_4_ = iVar8;
      auVar15._0_4_ = iVar8;
      auVar15._8_4_ = iVar8;
      auVar15._12_4_ = iVar8;
      auVar15._16_4_ = iVar8;
      auVar15._20_4_ = iVar8;
      auVar15._24_4_ = iVar8;
      auVar15._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar15,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
LAB_0048290d:
    auVar10 = vpunpckldq_avx2((undefined1  [32])_local_820,local_7e0);
    auVar55 = vpunpckhdq_avx2((undefined1  [32])_local_820,local_7e0);
    auVar11 = vpunpckldq_avx2(local_7a0,local_760);
    auVar25 = vpunpckhdq_avx2(local_7a0,local_760);
    auVar12 = vpunpckldq_avx2(local_720,local_6e0);
    auVar51 = vpunpckhdq_avx2(local_720,local_6e0);
    auVar47 = vpunpckldq_avx2(local_6a0,local_660);
    auVar26 = vpunpckhdq_avx2(local_6a0,local_660);
    auVar37 = vpunpcklqdq_avx2(auVar10,auVar11);
    auVar38 = vpunpcklqdq_avx2(auVar12,auVar47);
    local_c20._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
    local_c20._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
    local_b20 = vperm2i128_avx2(auVar37,auVar38,0x31);
    auVar10 = vpunpckhqdq_avx2(auVar10,auVar11);
    auVar11 = vpunpckhqdq_avx2(auVar12,auVar47);
    local_be0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_be0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_ae0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar10 = vpunpcklqdq_avx2(auVar55,auVar25);
    auVar11 = vpunpcklqdq_avx2(auVar51,auVar26);
    local_ba0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_ba0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_aa0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar55 = vpunpckhqdq_avx2(auVar55,auVar25);
    auVar25 = vpunpckhqdq_avx2(auVar51,auVar26);
    local_b60._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar55._0_16_;
    local_b60._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar25._0_16_;
    local_a60 = vperm2i128_avx2(auVar55,auVar25,0x31);
    auVar12 = vunpcklps_avx(local_800,local_7c0);
    auVar51 = vunpckhps_avx(local_800,local_7c0);
    auVar47 = vunpcklps_avx(local_780,local_740);
    auVar26 = vunpckhps_avx(local_780,local_740);
    auVar37 = vunpcklps_avx(local_700,local_6c0);
    auVar10 = vunpckhps_avx(local_700,local_6c0);
    auVar38 = vunpcklps_avx(local_680,local_640);
    auVar11 = vunpckhps_avx(local_680,local_640);
    auVar55 = vunpcklpd_avx(auVar12,auVar47);
    auVar25 = vunpcklpd_avx(auVar37,auVar38);
    local_a20._16_16_ = auVar25._0_16_;
    local_a20._0_16_ = auVar55._0_16_;
    local_920 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar12,auVar47);
    auVar25 = vunpckhpd_avx(auVar37,auVar38);
    local_9e0._16_16_ = auVar25._0_16_;
    local_9e0._0_16_ = auVar55._0_16_;
    local_8e0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpcklpd_avx(auVar51,auVar26);
    auVar25 = vunpcklpd_avx(auVar10,auVar11);
    local_9a0._16_16_ = auVar25._0_16_;
    local_9a0._0_16_ = auVar55._0_16_;
    local_8a0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar51,auVar26);
    auVar25 = vunpckhpd_avx(auVar10,auVar11);
    local_960._16_16_ = auVar25._0_16_;
    local_960._0_16_ = auVar55._0_16_;
    local_860 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar12 = vunpcklps_avx(local_620,local_5e0);
    auVar51 = vunpckhps_avx(local_620,local_5e0);
    auVar47 = vunpcklps_avx(local_5a0,local_560);
    auVar26 = vunpckhps_avx(local_5a0,local_560);
    auVar37 = vunpcklps_avx(local_520,local_4e0);
    auVar10 = vunpckhps_avx(local_520,local_4e0);
    auVar38 = vunpcklps_avx(local_4a0,local_460);
    auVar11 = vunpckhps_avx(local_4a0,local_460);
    auVar55 = vunpcklpd_avx(auVar12,auVar47);
    auVar25 = vunpcklpd_avx(auVar37,auVar38);
    local_c00._16_16_ = auVar25._0_16_;
    local_c00._0_16_ = auVar55._0_16_;
    local_b00 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar12,auVar47);
    auVar25 = vunpckhpd_avx(auVar37,auVar38);
    local_bc0._16_16_ = auVar25._0_16_;
    local_bc0._0_16_ = auVar55._0_16_;
    local_ac0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpcklpd_avx(auVar51,auVar26);
    auVar25 = vunpcklpd_avx(auVar10,auVar11);
    local_b80._16_16_ = auVar25._0_16_;
    local_b80._0_16_ = auVar55._0_16_;
    local_a80 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar51,auVar26);
    auVar25 = vunpckhpd_avx(auVar10,auVar11);
    local_b40._16_16_ = auVar25._0_16_;
    local_b40._0_16_ = auVar55._0_16_;
    local_a40 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar10 = vpunpckldq_avx2(local_600,local_5c0);
    auVar55 = vpunpckhdq_avx2(local_600,local_5c0);
    auVar11 = vpunpckldq_avx2(local_580,local_540);
    auVar25 = vpunpckhdq_avx2(local_580,local_540);
    auVar12 = vpunpckldq_avx2(local_500,local_4c0);
    auVar51 = vpunpckhdq_avx2(local_500,local_4c0);
    auVar47 = vpunpckldq_avx2(local_480,local_440);
    auVar26 = vpunpckhdq_avx2(local_480,local_440);
    auVar37 = vpunpcklqdq_avx2(auVar10,auVar11);
    auVar38 = vpunpcklqdq_avx2(auVar12,auVar47);
    local_a00._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
    local_a00._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
    local_900 = vperm2i128_avx2(auVar37,auVar38,0x31);
    auVar10 = vpunpckhqdq_avx2(auVar10,auVar11);
    auVar11 = vpunpckhqdq_avx2(auVar12,auVar47);
    local_9c0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_9c0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_8c0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar10 = vpunpcklqdq_avx2(auVar55,auVar25);
    auVar11 = vpunpcklqdq_avx2(auVar51,auVar26);
    local_980._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_980._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_880 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar55 = vpunpckhqdq_avx2(auVar55,auVar25);
    auVar25 = vpunpckhqdq_avx2(auVar51,auVar26);
    local_940._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar55._0_16_;
    local_940._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar25._0_16_;
    local_840 = vperm2i128_avx2(auVar55,auVar25,0x31);
    fdct16_avx2(&local_c20,(__m256i *)local_820,'\f',2,2);
    goto LAB_00483955;
  case 0xc:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar18._4_4_ = iVar8;
      auVar18._0_4_ = iVar8;
      auVar18._8_4_ = iVar8;
      auVar18._12_4_ = iVar8;
      auVar18._16_4_ = iVar8;
      auVar18._20_4_ = iVar8;
      auVar18._24_4_ = iVar8;
      auVar18._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar18,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fadst16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar19._4_4_ = iVar8;
      auVar19._0_4_ = iVar8;
      auVar19._8_4_ = iVar8;
      auVar19._12_4_ = iVar8;
      auVar19._16_4_ = iVar8;
      auVar19._20_4_ = iVar8;
      auVar19._24_4_ = iVar8;
      auVar19._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar19,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    auVar10 = vpunpckldq_avx2((undefined1  [32])_local_820,local_7e0);
    auVar55 = vpunpckhdq_avx2((undefined1  [32])_local_820,local_7e0);
    auVar11 = vpunpckldq_avx2(local_7a0,local_760);
    auVar25 = vpunpckhdq_avx2(local_7a0,local_760);
    auVar12 = vpunpckldq_avx2(local_720,local_6e0);
    auVar51 = vpunpckhdq_avx2(local_720,local_6e0);
    auVar47 = vpunpckldq_avx2(local_6a0,local_660);
    auVar26 = vpunpckhdq_avx2(local_6a0,local_660);
    auVar37 = vpunpcklqdq_avx2(auVar10,auVar11);
    auVar38 = vpunpcklqdq_avx2(auVar12,auVar47);
    auVar57 = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
    auVar60 = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
    local_c20[0] = auVar57._0_8_;
    local_c20[1] = auVar57._8_8_;
    local_c20[2] = auVar60._0_8_;
    local_c20[3] = auVar60._8_8_;
    local_b20 = vperm2i128_avx2(auVar37,auVar38,0x31);
    auVar10 = vpunpckhqdq_avx2(auVar10,auVar11);
    auVar11 = vpunpckhqdq_avx2(auVar12,auVar47);
    local_be0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_be0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_ae0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar10 = vpunpcklqdq_avx2(auVar55,auVar25);
    auVar11 = vpunpcklqdq_avx2(auVar51,auVar26);
    local_ba0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_ba0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_aa0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar55 = vpunpckhqdq_avx2(auVar55,auVar25);
    auVar25 = vpunpckhqdq_avx2(auVar51,auVar26);
    local_b60._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar55._0_16_;
    local_b60._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar25._0_16_;
    local_a60 = vperm2i128_avx2(auVar55,auVar25,0x31);
    auVar12 = vunpcklps_avx(local_800,local_7c0);
    auVar51 = vunpckhps_avx(local_800,local_7c0);
    auVar47 = vunpcklps_avx(local_780,local_740);
    auVar26 = vunpckhps_avx(local_780,local_740);
    auVar37 = vunpcklps_avx(local_700,local_6c0);
    auVar10 = vunpckhps_avx(local_700,local_6c0);
    auVar38 = vunpcklps_avx(local_680,local_640);
    auVar11 = vunpckhps_avx(local_680,local_640);
    auVar55 = vunpcklpd_avx(auVar12,auVar47);
    auVar25 = vunpcklpd_avx(auVar37,auVar38);
    local_a20._16_16_ = auVar25._0_16_;
    local_a20._0_16_ = auVar55._0_16_;
    local_920 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar12,auVar47);
    auVar25 = vunpckhpd_avx(auVar37,auVar38);
    local_9e0._16_16_ = auVar25._0_16_;
    local_9e0._0_16_ = auVar55._0_16_;
    local_8e0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpcklpd_avx(auVar51,auVar26);
    auVar25 = vunpcklpd_avx(auVar10,auVar11);
    local_9a0._16_16_ = auVar25._0_16_;
    local_9a0._0_16_ = auVar55._0_16_;
    local_8a0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar51,auVar26);
    auVar25 = vunpckhpd_avx(auVar10,auVar11);
    local_960._16_16_ = auVar25._0_16_;
    local_960._0_16_ = auVar55._0_16_;
    local_860 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar12 = vunpcklps_avx(local_620,local_5e0);
    auVar51 = vunpckhps_avx(local_620,local_5e0);
    auVar47 = vunpcklps_avx(local_5a0,local_560);
    auVar26 = vunpckhps_avx(local_5a0,local_560);
    auVar37 = vunpcklps_avx(local_520,local_4e0);
    auVar10 = vunpckhps_avx(local_520,local_4e0);
    auVar38 = vunpcklps_avx(local_4a0,local_460);
    auVar11 = vunpckhps_avx(local_4a0,local_460);
    auVar55 = vunpcklpd_avx(auVar12,auVar47);
    auVar25 = vunpcklpd_avx(auVar37,auVar38);
    local_c00._16_16_ = auVar25._0_16_;
    local_c00._0_16_ = auVar55._0_16_;
    local_b00 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar12,auVar47);
    auVar25 = vunpckhpd_avx(auVar37,auVar38);
    local_bc0._16_16_ = auVar25._0_16_;
    local_bc0._0_16_ = auVar55._0_16_;
    local_ac0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpcklpd_avx(auVar51,auVar26);
    auVar25 = vunpcklpd_avx(auVar10,auVar11);
    local_b80._16_16_ = auVar25._0_16_;
    local_b80._0_16_ = auVar55._0_16_;
    local_a80 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar51,auVar26);
    auVar25 = vunpckhpd_avx(auVar10,auVar11);
    local_b40._16_16_ = auVar25._0_16_;
    local_b40._0_16_ = auVar55._0_16_;
    local_a40 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar10 = vpunpckldq_avx2(local_600,local_5c0);
    auVar55 = vpunpckhdq_avx2(local_600,local_5c0);
    auVar11 = vpunpckldq_avx2(local_580,local_540);
    auVar25 = vpunpckhdq_avx2(local_580,local_540);
    auVar12 = vpunpckldq_avx2(local_500,local_4c0);
    auVar51 = vpunpckhdq_avx2(local_500,local_4c0);
    auVar47 = vpunpckldq_avx2(local_480,local_440);
    auVar26 = vpunpckhdq_avx2(local_480,local_440);
    auVar37 = vpunpcklqdq_avx2(auVar10,auVar11);
    auVar38 = vpunpcklqdq_avx2(auVar12,auVar47);
    local_a00._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
    local_a00._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
    local_900 = vperm2i128_avx2(auVar37,auVar38,0x31);
    auVar10 = vpunpckhqdq_avx2(auVar10,auVar11);
    auVar11 = vpunpckhqdq_avx2(auVar12,auVar47);
    local_9c0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_9c0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_8c0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar10 = vpunpcklqdq_avx2(auVar55,auVar25);
    auVar11 = vpunpcklqdq_avx2(auVar51,auVar26);
    local_980._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_980._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_880 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar55 = vpunpckhqdq_avx2(auVar55,auVar25);
    auVar25 = vpunpckhqdq_avx2(auVar51,auVar26);
    local_940._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar55._0_16_;
    local_940._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar25._0_16_;
    local_840 = vperm2i128_avx2(auVar55,auVar25,0x31);
    lVar9 = 0;
    auVar20._8_4_ = 0x2d42;
    auVar20._0_8_ = 0x2d4200002d42;
    auVar20._12_4_ = 0x2d42;
    auVar20._16_4_ = 0x2d42;
    auVar20._20_4_ = 0x2d42;
    auVar20._24_4_ = 0x2d42;
    auVar20._28_4_ = 0x2d42;
    auVar49._8_4_ = 0x800;
    auVar49._0_8_ = 0x80000000800;
    auVar49._12_4_ = 0x800;
    auVar49._16_4_ = 0x800;
    auVar49._20_4_ = 0x800;
    auVar49._24_4_ = 0x800;
    auVar49._28_4_ = 0x800;
    do {
      auVar55 = vpmulld_avx2(auVar20,*(undefined1 (*) [32])((long)local_c20 + lVar9));
      auVar55 = vpaddd_avx2(auVar55,auVar49);
      auVar55 = vpsrad_avx2(auVar55,0xc);
      *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x400);
    goto LAB_00483955;
  case 0xd:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar37._4_4_ = iVar8;
      auVar37._0_4_ = iVar8;
      auVar37._8_4_ = iVar8;
      auVar37._12_4_ = iVar8;
      auVar37._16_4_ = iVar8;
      auVar37._20_4_ = iVar8;
      auVar37._24_4_ = iVar8;
      auVar37._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar37,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    lVar9 = 0;
    auVar38._8_4_ = 0x2d42;
    auVar38._0_8_ = 0x2d4200002d42;
    auVar38._12_4_ = 0x2d42;
    auVar38._16_4_ = 0x2d42;
    auVar38._20_4_ = 0x2d42;
    auVar38._24_4_ = 0x2d42;
    auVar38._28_4_ = 0x2d42;
    auVar52._8_4_ = 0x800;
    auVar52._0_8_ = 0x80000000800;
    auVar52._12_4_ = 0x800;
    auVar52._16_4_ = 0x800;
    auVar52._20_4_ = 0x800;
    auVar52._24_4_ = 0x800;
    auVar52._28_4_ = 0x800;
    do {
      auVar55 = vpmulld_avx2(auVar38,*(undefined1 (*) [32])((long)local_c20 + lVar9));
      auVar55 = vpaddd_avx2(auVar55,auVar52);
      auVar55 = vpsrad_avx2(auVar55,0xc);
      *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x400);
    bVar2 = av1_fwd_txfm_shift_ls[2][1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar39._4_4_ = iVar8;
      auVar39._0_4_ = iVar8;
      auVar39._8_4_ = iVar8;
      auVar39._12_4_ = iVar8;
      auVar39._16_4_ = iVar8;
      auVar39._20_4_ = iVar8;
      auVar39._24_4_ = iVar8;
      auVar39._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar39,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    break;
  case 0xe:
    lVar9 = 0x200;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_840 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_840 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_840 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_840 + lVar9 + 0x18) = uVar6;
      input = input + stride;
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != 0);
    lVar9 = 0;
    do {
      auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9));
      auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(local_820 + lVar9 + 0x10));
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar25;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar10._4_4_ = iVar8;
      auVar10._0_4_ = iVar8;
      auVar10._8_4_ = iVar8;
      auVar10._12_4_ = iVar8;
      auVar10._16_4_ = iVar8;
      auVar10._20_4_ = iVar8;
      auVar10._24_4_ = iVar8;
      auVar10._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar10,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    fadst16_avx2(&local_c20,(__m256i *)local_820,'\r',2,2);
    bVar2 = piVar7[1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar11._4_4_ = iVar8;
      auVar11._0_4_ = iVar8;
      auVar11._8_4_ = iVar8;
      auVar11._12_4_ = iVar8;
      auVar11._16_4_ = iVar8;
      auVar11._20_4_ = iVar8;
      auVar11._24_4_ = iVar8;
      auVar11._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar11,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    auVar10 = vpunpckldq_avx2((undefined1  [32])_local_820,local_7e0);
    auVar55 = vpunpckhdq_avx2((undefined1  [32])_local_820,local_7e0);
    auVar11 = vpunpckldq_avx2(local_7a0,local_760);
    auVar25 = vpunpckhdq_avx2(local_7a0,local_760);
    auVar12 = vpunpckldq_avx2(local_720,local_6e0);
    auVar51 = vpunpckhdq_avx2(local_720,local_6e0);
    auVar47 = vpunpckldq_avx2(local_6a0,local_660);
    auVar26 = vpunpckhdq_avx2(local_6a0,local_660);
    auVar37 = vpunpcklqdq_avx2(auVar10,auVar11);
    auVar38 = vpunpcklqdq_avx2(auVar12,auVar47);
    auVar56 = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
    auVar59 = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
    local_c20[0] = auVar56._0_8_;
    local_c20[1] = auVar56._8_8_;
    local_c20[2] = auVar59._0_8_;
    local_c20[3] = auVar59._8_8_;
    local_b20 = vperm2i128_avx2(auVar37,auVar38,0x31);
    auVar10 = vpunpckhqdq_avx2(auVar10,auVar11);
    auVar11 = vpunpckhqdq_avx2(auVar12,auVar47);
    local_be0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_be0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_ae0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar10 = vpunpcklqdq_avx2(auVar55,auVar25);
    auVar11 = vpunpcklqdq_avx2(auVar51,auVar26);
    local_ba0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_ba0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_aa0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar55 = vpunpckhqdq_avx2(auVar55,auVar25);
    auVar25 = vpunpckhqdq_avx2(auVar51,auVar26);
    local_b60._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar55._0_16_;
    local_b60._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar25._0_16_;
    local_a60 = vperm2i128_avx2(auVar55,auVar25,0x31);
    auVar12 = vunpcklps_avx(local_800,local_7c0);
    auVar51 = vunpckhps_avx(local_800,local_7c0);
    auVar47 = vunpcklps_avx(local_780,local_740);
    auVar26 = vunpckhps_avx(local_780,local_740);
    auVar37 = vunpcklps_avx(local_700,local_6c0);
    auVar10 = vunpckhps_avx(local_700,local_6c0);
    auVar38 = vunpcklps_avx(local_680,local_640);
    auVar11 = vunpckhps_avx(local_680,local_640);
    auVar55 = vunpcklpd_avx(auVar12,auVar47);
    auVar25 = vunpcklpd_avx(auVar37,auVar38);
    local_a20._16_16_ = auVar25._0_16_;
    local_a20._0_16_ = auVar55._0_16_;
    local_920 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar12,auVar47);
    auVar25 = vunpckhpd_avx(auVar37,auVar38);
    local_9e0._16_16_ = auVar25._0_16_;
    local_9e0._0_16_ = auVar55._0_16_;
    local_8e0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpcklpd_avx(auVar51,auVar26);
    auVar25 = vunpcklpd_avx(auVar10,auVar11);
    local_9a0._16_16_ = auVar25._0_16_;
    local_9a0._0_16_ = auVar55._0_16_;
    local_8a0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar51,auVar26);
    auVar25 = vunpckhpd_avx(auVar10,auVar11);
    local_960._16_16_ = auVar25._0_16_;
    local_960._0_16_ = auVar55._0_16_;
    local_860 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar12 = vunpcklps_avx(local_620,local_5e0);
    auVar51 = vunpckhps_avx(local_620,local_5e0);
    auVar47 = vunpcklps_avx(local_5a0,local_560);
    auVar26 = vunpckhps_avx(local_5a0,local_560);
    auVar37 = vunpcklps_avx(local_520,local_4e0);
    auVar10 = vunpckhps_avx(local_520,local_4e0);
    auVar38 = vunpcklps_avx(local_4a0,local_460);
    auVar11 = vunpckhps_avx(local_4a0,local_460);
    auVar55 = vunpcklpd_avx(auVar12,auVar47);
    auVar25 = vunpcklpd_avx(auVar37,auVar38);
    local_c00._16_16_ = auVar25._0_16_;
    local_c00._0_16_ = auVar55._0_16_;
    local_b00 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar12,auVar47);
    auVar25 = vunpckhpd_avx(auVar37,auVar38);
    local_bc0._16_16_ = auVar25._0_16_;
    local_bc0._0_16_ = auVar55._0_16_;
    local_ac0 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpcklpd_avx(auVar51,auVar26);
    auVar25 = vunpcklpd_avx(auVar10,auVar11);
    local_b80._16_16_ = auVar25._0_16_;
    local_b80._0_16_ = auVar55._0_16_;
    local_a80 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar55 = vunpckhpd_avx(auVar51,auVar26);
    auVar25 = vunpckhpd_avx(auVar10,auVar11);
    local_b40._16_16_ = auVar25._0_16_;
    local_b40._0_16_ = auVar55._0_16_;
    local_a40 = vperm2f128_avx(auVar55,auVar25,0x31);
    auVar10 = vpunpckldq_avx2(local_600,local_5c0);
    auVar55 = vpunpckhdq_avx2(local_600,local_5c0);
    auVar11 = vpunpckldq_avx2(local_580,local_540);
    auVar25 = vpunpckhdq_avx2(local_580,local_540);
    auVar12 = vpunpckldq_avx2(local_500,local_4c0);
    auVar51 = vpunpckhdq_avx2(local_500,local_4c0);
    auVar47 = vpunpckldq_avx2(local_480,local_440);
    auVar26 = vpunpckhdq_avx2(local_480,local_440);
    auVar37 = vpunpcklqdq_avx2(auVar10,auVar11);
    auVar38 = vpunpcklqdq_avx2(auVar12,auVar47);
    local_a00._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
    local_a00._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
    local_900 = vperm2i128_avx2(auVar37,auVar38,0x31);
    auVar10 = vpunpckhqdq_avx2(auVar10,auVar11);
    auVar11 = vpunpckhqdq_avx2(auVar12,auVar47);
    local_9c0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_9c0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_8c0 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar10 = vpunpcklqdq_avx2(auVar55,auVar25);
    auVar11 = vpunpcklqdq_avx2(auVar51,auVar26);
    local_980._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
    local_980._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
    local_880 = vperm2i128_avx2(auVar10,auVar11,0x31);
    auVar55 = vpunpckhqdq_avx2(auVar55,auVar25);
    auVar25 = vpunpckhqdq_avx2(auVar51,auVar26);
    local_940._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar55._0_16_;
    local_940._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar25._0_16_;
    local_840 = vperm2i128_avx2(auVar55,auVar25,0x31);
    lVar9 = 0;
    auVar12._8_4_ = 0x2d42;
    auVar12._0_8_ = 0x2d4200002d42;
    auVar12._12_4_ = 0x2d42;
    auVar12._16_4_ = 0x2d42;
    auVar12._20_4_ = 0x2d42;
    auVar12._24_4_ = 0x2d42;
    auVar12._28_4_ = 0x2d42;
    auVar47._8_4_ = 0x800;
    auVar47._0_8_ = 0x80000000800;
    auVar47._12_4_ = 0x800;
    auVar47._16_4_ = 0x800;
    auVar47._20_4_ = 0x800;
    auVar47._24_4_ = 0x800;
    auVar47._28_4_ = 0x800;
    do {
      auVar55 = vpmulld_avx2(auVar12,*(undefined1 (*) [32])((long)local_c20 + lVar9));
      auVar55 = vpaddd_avx2(auVar55,auVar47);
      auVar55 = vpsrad_avx2(auVar55,0xc);
      *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x400);
    goto LAB_00483955;
  case 0xf:
    lVar9 = 0;
    do {
      uVar4 = *(undefined8 *)(input + 4);
      uVar5 = *(undefined8 *)(input + 8);
      uVar6 = *(undefined8 *)(input + 0xc);
      *(undefined8 *)(local_820 + lVar9) = *(undefined8 *)input;
      *(undefined8 *)(local_820 + lVar9 + 8) = uVar4;
      *(undefined8 *)(local_820 + lVar9 + 0x10) = uVar5;
      *(undefined8 *)(local_820 + lVar9 + 0x18) = uVar6;
      lVar9 = lVar9 + 0x20;
      input = input + stride;
    } while (lVar9 != 0x200);
    lVar9 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])(local_820 + lVar9 + 0x10);
      auVar3 = vpshufb_avx(*(undefined1 (*) [16])(local_820 + lVar9),_DAT_0056bda0);
      auVar55 = vpmovsxwd_avx2(auVar3);
      *(undefined1 (*) [32])(local_c00 + lVar9 * 2) = auVar55;
      auVar1 = vpshufb_avx(auVar1,_DAT_0056bda0);
      auVar55 = vpmovsxwd_avx2(auVar1);
      *(undefined1 (*) [32])((long)local_c20 + lVar9 * 2) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x200);
    bVar2 = *av1_fwd_txfm_shift_ls[2];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar55._4_4_ = iVar8;
      auVar55._0_4_ = iVar8;
      auVar55._8_4_ = iVar8;
      auVar55._12_4_ = iVar8;
      auVar55._16_4_ = iVar8;
      auVar55._20_4_ = iVar8;
      auVar55._24_4_ = iVar8;
      auVar55._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar25 = vpaddd_avx2(auVar55,*(undefined1 (*) [32])((long)local_c20 + lVar9));
        auVar25 = vpsrad_avx2(auVar25,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar25;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])((long)local_c20 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])((long)local_c20 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    lVar9 = 0;
    auVar25._8_4_ = 0x2d42;
    auVar25._0_8_ = 0x2d4200002d42;
    auVar25._12_4_ = 0x2d42;
    auVar25._16_4_ = 0x2d42;
    auVar25._20_4_ = 0x2d42;
    auVar25._24_4_ = 0x2d42;
    auVar25._28_4_ = 0x2d42;
    auVar51._8_4_ = 0x800;
    auVar51._0_8_ = 0x80000000800;
    auVar51._12_4_ = 0x800;
    auVar51._16_4_ = 0x800;
    auVar51._20_4_ = 0x800;
    auVar51._24_4_ = 0x800;
    auVar51._28_4_ = 0x800;
    do {
      auVar55 = vpmulld_avx2(auVar25,*(undefined1 (*) [32])((long)local_c20 + lVar9));
      auVar55 = vpaddd_avx2(auVar55,auVar51);
      auVar55 = vpsrad_avx2(auVar55,0xc);
      *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x400);
    bVar2 = av1_fwd_txfm_shift_ls[2][1];
    if ((char)bVar2 < '\0') {
      iVar8 = 1 << (~bVar2 & 0x1f);
      auVar26._4_4_ = iVar8;
      auVar26._0_4_ = iVar8;
      auVar26._8_4_ = iVar8;
      auVar26._12_4_ = iVar8;
      auVar26._16_4_ = iVar8;
      auVar26._20_4_ = iVar8;
      auVar26._24_4_ = iVar8;
      auVar26._28_4_ = iVar8;
      lVar9 = 0;
      do {
        auVar55 = vpaddd_avx2(auVar26,*(undefined1 (*) [32])(local_820 + lVar9));
        auVar55 = vpsrad_avx2(auVar55,ZEXT416((uint)-(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
    else if (bVar2 != 0) {
      lVar9 = 0;
      do {
        auVar55 = vpslld_avx2(*(undefined1 (*) [32])(local_820 + lVar9),
                              ZEXT416((uint)(int)(char)bVar2));
        *(undefined1 (*) [32])(local_820 + lVar9) = auVar55;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x400);
    }
  }
  auVar10 = vpunpckldq_avx2((undefined1  [32])_local_820,local_7e0);
  auVar55 = vpunpckhdq_avx2((undefined1  [32])_local_820,local_7e0);
  auVar11 = vpunpckldq_avx2(local_7a0,local_760);
  auVar25 = vpunpckhdq_avx2(local_7a0,local_760);
  auVar12 = vpunpckldq_avx2(local_720,local_6e0);
  auVar51 = vpunpckhdq_avx2(local_720,local_6e0);
  auVar47 = vpunpckldq_avx2(local_6a0,local_660);
  auVar26 = vpunpckhdq_avx2(local_6a0,local_660);
  auVar37 = vpunpcklqdq_avx2(auVar10,auVar11);
  auVar38 = vpunpcklqdq_avx2(auVar12,auVar47);
  local_c20._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
  local_c20._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
  local_b20 = vperm2i128_avx2(auVar37,auVar38,0x31);
  auVar10 = vpunpckhqdq_avx2(auVar10,auVar11);
  auVar11 = vpunpckhqdq_avx2(auVar12,auVar47);
  local_be0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
  local_be0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
  local_ae0 = vperm2i128_avx2(auVar10,auVar11,0x31);
  auVar10 = vpunpcklqdq_avx2(auVar55,auVar25);
  auVar11 = vpunpcklqdq_avx2(auVar51,auVar26);
  local_ba0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
  local_ba0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
  local_aa0 = vperm2i128_avx2(auVar10,auVar11,0x31);
  auVar55 = vpunpckhqdq_avx2(auVar55,auVar25);
  auVar25 = vpunpckhqdq_avx2(auVar51,auVar26);
  local_b60._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar55._0_16_;
  local_b60._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar25._0_16_;
  local_a60 = vperm2i128_avx2(auVar55,auVar25,0x31);
  auVar12 = vunpcklps_avx(local_800,local_7c0);
  auVar51 = vunpckhps_avx(local_800,local_7c0);
  auVar47 = vunpcklps_avx(local_780,local_740);
  auVar26 = vunpckhps_avx(local_780,local_740);
  auVar37 = vunpcklps_avx(local_700,local_6c0);
  auVar10 = vunpckhps_avx(local_700,local_6c0);
  auVar38 = vunpcklps_avx(local_680,local_640);
  auVar11 = vunpckhps_avx(local_680,local_640);
  auVar55 = vunpcklpd_avx(auVar12,auVar47);
  auVar25 = vunpcklpd_avx(auVar37,auVar38);
  local_a20._16_16_ = auVar25._0_16_;
  local_a20._0_16_ = auVar55._0_16_;
  local_920 = vperm2f128_avx(auVar55,auVar25,0x31);
  auVar55 = vunpckhpd_avx(auVar12,auVar47);
  auVar25 = vunpckhpd_avx(auVar37,auVar38);
  local_9e0._16_16_ = auVar25._0_16_;
  local_9e0._0_16_ = auVar55._0_16_;
  local_8e0 = vperm2f128_avx(auVar55,auVar25,0x31);
  auVar55 = vunpcklpd_avx(auVar51,auVar26);
  auVar25 = vunpcklpd_avx(auVar10,auVar11);
  local_9a0._16_16_ = auVar25._0_16_;
  local_9a0._0_16_ = auVar55._0_16_;
  local_8a0 = vperm2f128_avx(auVar55,auVar25,0x31);
  auVar55 = vunpckhpd_avx(auVar51,auVar26);
  auVar25 = vunpckhpd_avx(auVar10,auVar11);
  local_960._16_16_ = auVar25._0_16_;
  local_960._0_16_ = auVar55._0_16_;
  local_860 = vperm2f128_avx(auVar55,auVar25,0x31);
  auVar12 = vunpcklps_avx(local_620,local_5e0);
  auVar51 = vunpckhps_avx(local_620,local_5e0);
  auVar47 = vunpcklps_avx(local_5a0,local_560);
  auVar26 = vunpckhps_avx(local_5a0,local_560);
  auVar37 = vunpcklps_avx(local_520,local_4e0);
  auVar10 = vunpckhps_avx(local_520,local_4e0);
  auVar38 = vunpcklps_avx(local_4a0,local_460);
  auVar11 = vunpckhps_avx(local_4a0,local_460);
  auVar55 = vunpcklpd_avx(auVar12,auVar47);
  auVar25 = vunpcklpd_avx(auVar37,auVar38);
  local_c00._16_16_ = auVar25._0_16_;
  local_c00._0_16_ = auVar55._0_16_;
  local_b00 = vperm2f128_avx(auVar55,auVar25,0x31);
  auVar55 = vunpckhpd_avx(auVar12,auVar47);
  auVar25 = vunpckhpd_avx(auVar37,auVar38);
  local_bc0._16_16_ = auVar25._0_16_;
  local_bc0._0_16_ = auVar55._0_16_;
  local_ac0 = vperm2f128_avx(auVar55,auVar25,0x31);
  auVar55 = vunpcklpd_avx(auVar51,auVar26);
  auVar25 = vunpcklpd_avx(auVar10,auVar11);
  local_b80._16_16_ = auVar25._0_16_;
  local_b80._0_16_ = auVar55._0_16_;
  local_a80 = vperm2f128_avx(auVar55,auVar25,0x31);
  auVar55 = vunpckhpd_avx(auVar51,auVar26);
  auVar25 = vunpckhpd_avx(auVar10,auVar11);
  local_b40._16_16_ = auVar25._0_16_;
  local_b40._0_16_ = auVar55._0_16_;
  local_a40 = vperm2f128_avx(auVar55,auVar25,0x31);
  auVar10 = vpunpckldq_avx2(local_600,local_5c0);
  auVar55 = vpunpckhdq_avx2(local_600,local_5c0);
  auVar11 = vpunpckldq_avx2(local_580,local_540);
  auVar25 = vpunpckhdq_avx2(local_580,local_540);
  auVar12 = vpunpckldq_avx2(local_500,local_4c0);
  auVar51 = vpunpckhdq_avx2(local_500,local_4c0);
  auVar47 = vpunpckldq_avx2(local_480,local_440);
  auVar26 = vpunpckhdq_avx2(local_480,local_440);
  auVar37 = vpunpcklqdq_avx2(auVar10,auVar11);
  auVar38 = vpunpcklqdq_avx2(auVar12,auVar47);
  local_a00._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar37._0_16_;
  local_a00._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar38._0_16_;
  local_900 = vperm2i128_avx2(auVar37,auVar38,0x31);
  auVar10 = vpunpckhqdq_avx2(auVar10,auVar11);
  auVar11 = vpunpckhqdq_avx2(auVar12,auVar47);
  local_9c0._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
  local_9c0._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
  local_8c0 = vperm2i128_avx2(auVar10,auVar11,0x31);
  auVar10 = vpunpcklqdq_avx2(auVar55,auVar25);
  auVar11 = vpunpcklqdq_avx2(auVar51,auVar26);
  local_980._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar10._0_16_;
  local_980._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar11._0_16_;
  local_880 = vperm2i128_avx2(auVar10,auVar11,0x31);
  auVar55 = vpunpckhqdq_avx2(auVar55,auVar25);
  auVar25 = vpunpckhqdq_avx2(auVar51,auVar26);
  local_940._0_16_ = ZEXT116(0) * auVar25._0_16_ + ZEXT116(1) * auVar55._0_16_;
  local_940._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar25._0_16_;
  local_840 = vperm2i128_avx2(auVar55,auVar25,0x31);
  fadst16_avx2(&local_c20,(__m256i *)local_820,'\f',2,2);
LAB_00483955:
  memcpy(coeff,local_820,0x400);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x16_avx2(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m256i in[32], out[32];
  const TX_SIZE tx_size = TX_16X16;
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const int width_div8 = (width >> 3);
  const int width_div16 = (width >> 4);
  const int size = (height << 1);
  switch (tx_type) {
    case DCT_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case ADST_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case DCT_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case ADST_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case FLIPADST_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case DCT_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case ADST_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case FLIPADST_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case IDTX:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case V_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fdct16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case H_DCT:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fdct16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case V_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case H_ADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case V_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 1, 0);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      fadst16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                   width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      idtx16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    case H_FLIPADST:
      load_buffer_16xn_avx2(input, in, stride, height, width_div8, 0, 1);
      round_shift_32_8xn_avx2(in, size, shift[0], width_div16);
      idtx16_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      round_shift_32_8xn_avx2(out, size, shift[1], width_div16);
      fwd_txfm_transpose_16x16_avx2(out, in);
      fadst16_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                   width_div8);
      store_buffer_avx2(out, coeff, 8, 32);
      break;
    default: assert(0);
  }
  (void)bd;
}